

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

Result<void> * __thiscall
Chainstate::InvalidateCoinsDBOnDisk(Result<void> *__return_storage_ptr__,Chainstate *this)

{
  long lVar1;
  CCoinsViewDB *this_00;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  string log_msg;
  bool local_1f8;
  string dest_str;
  string src_str;
  string target;
  string dbpath;
  path local_120;
  path invalid_path;
  path snapshot_datadir;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>._M_payload.
      super__Optional_payload_base<uint256>._M_engaged == false) {
    __assert_fail("cs.m_from_snapshot_blockhash",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                  ,0x18b0,"fs::path GetSnapshotCoinsDBPath(Chainstate &)");
  }
  this_00 = CoinsDB(this);
  CCoinsViewDB::StoragePath((optional<fs::path> *)&log_msg,this_00);
  if (local_1f8 != false) {
    std::filesystem::__cxx11::path::path(&snapshot_datadir.super_path,(path *)&log_msg);
    std::_Optional_payload_base<fs::path>::_M_reset((_Optional_payload_base<fs::path> *)&log_msg);
    std::__uniq_ptr_impl<CoinsViews,_std::default_delete<CoinsViews>_>::reset
              ((__uniq_ptr_impl<CoinsViews,_std::default_delete<CoinsViews>_> *)&this->m_coins_views
               ,(pointer)0x0);
    std::filesystem::__cxx11::path::path(&local_120,&snapshot_datadir.super_path);
    fs::operator+(&invalid_path,(path *)&local_120,"_INVALID");
    std::filesystem::__cxx11::path::~path(&local_120);
    std::filesystem::__cxx11::path::string(&dbpath,&snapshot_datadir.super_path);
    std::filesystem::__cxx11::path::string(&target,&invalid_path.super_path);
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp";
    source_file._M_len = 0x57;
    logging_function._M_str = "InvalidateCoinsDBOnDisk";
    logging_function._M_len = 0x17;
    LogPrintf_<std::__cxx11::string,std::__cxx11::string>
              (logging_function,source_file,0x18c1,ALL,Info,
               "[snapshot] renaming snapshot datadir %s to %s\n",&dbpath,&target);
    std::filesystem::rename((path *)&snapshot_datadir,(path *)&invalid_path);
    *(__index_type *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
             super__Move_assign_alias<bilingual_str,_std::monostate>.
             super__Copy_assign_alias<bilingual_str,_std::monostate>.
             super__Move_ctor_alias<bilingual_str,_std::monostate>.
             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
             super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x40) = '\x01';
    std::__cxx11::string::~string((string *)&target);
    std::__cxx11::string::~string((string *)&dbpath);
    std::filesystem::__cxx11::path::~path(&invalid_path.super_path);
    std::filesystem::__cxx11::path::~path(&snapshot_datadir.super_path);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return __return_storage_ptr__;
    }
    __stack_chk_fail();
  }
  __assert_fail("storage_path_maybe",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                ,0x18b3,"fs::path GetSnapshotCoinsDBPath(Chainstate &)");
}

Assistant:

util::Result<void> Chainstate::InvalidateCoinsDBOnDisk()
{
    fs::path snapshot_datadir = GetSnapshotCoinsDBPath(*this);

    // Coins views no longer usable.
    m_coins_views.reset();

    auto invalid_path = snapshot_datadir + "_INVALID";
    std::string dbpath = fs::PathToString(snapshot_datadir);
    std::string target = fs::PathToString(invalid_path);
    LogPrintf("[snapshot] renaming snapshot datadir %s to %s\n", dbpath, target);

    // The invalid snapshot datadir is simply moved and not deleted because we may
    // want to do forensics later during issue investigation. The user is instructed
    // accordingly in MaybeCompleteSnapshotValidation().
    try {
        fs::rename(snapshot_datadir, invalid_path);
    } catch (const fs::filesystem_error& e) {
        auto src_str = fs::PathToString(snapshot_datadir);
        auto dest_str = fs::PathToString(invalid_path);

        LogPrintf("%s: error renaming file '%s' -> '%s': %s\n",
                __func__, src_str, dest_str, e.what());
        return util::Error{strprintf(_(
            "Rename of '%s' -> '%s' failed. "
            "You should resolve this by manually moving or deleting the invalid "
            "snapshot directory %s, otherwise you will encounter the same error again "
            "on the next startup."),
            src_str, dest_str, src_str)};
    }
    return {};
}